

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O1

void __thiscall lzham::symbol_codec::arith_propagate_carry(symbol_codec *this)

{
  uchar *puVar1;
  uint uVar2;
  
  uVar2 = (this->m_arith_output_buf).m_size;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)uVar2 < 0) {
      return;
    }
    puVar1 = (this->m_arith_output_buf).m_p;
    if (puVar1[uVar2] != 0xff) break;
    puVar1[uVar2] = '\0';
  }
  puVar1[uVar2] = puVar1[uVar2] + '\x01';
  return;
}

Assistant:

inline uint size() const { return m_size; }